

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<int>::Add
          (RepeatedFieldWrapper<int> *this,Field *data,Value *value)

{
  RepeatedFieldType *this_00;
  int local_24;
  Value *local_20;
  Value *value_local;
  Field *data_local;
  RepeatedFieldWrapper<int> *this_local;
  
  local_20 = value;
  value_local = data;
  data_local = this;
  this_00 = MutableRepeatedField(data);
  local_24 = (*(this->super_RandomAccessRepeatedFieldAccessor).super_RepeatedFieldAccessor.
               _vptr_RepeatedFieldAccessor[0x10])(this,local_20);
  RepeatedField<int>::Add(this_00,&local_24);
  return;
}

Assistant:

void Add(Field* data, const Value* value) const override {
    MutableRepeatedField(data)->Add(ConvertToT(value));
  }